

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_SimpleArray<ON_3fPoint> * __thiscall
ON_3dPointListRef::To3fPointArray
          (ON_SimpleArray<ON_3fPoint> *__return_storage_ptr__,ON_3dPointListRef *this)

{
  uint uVar1;
  ON_3fPoint *pOVar2;
  double *pdVar3;
  float *pfVar4;
  uint uVar5;
  ulong new_capacity;
  
  __return_storage_ptr__->_vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a820;
  __return_storage_ptr__->m_a = (ON_3fPoint *)0x0;
  __return_storage_ptr__->m_count = 0;
  __return_storage_ptr__->m_capacity = 0;
  uVar1 = this->m_point_count;
  new_capacity = (ulong)uVar1;
  if (new_capacity != 0) {
    if ((ulong)(long)__return_storage_ptr__->m_capacity < new_capacity) {
      ON_SimpleArray<ON_3fPoint>::SetCapacity(__return_storage_ptr__,new_capacity);
    }
    if ((-1 < (int)uVar1) && ((int)uVar1 <= __return_storage_ptr__->m_capacity)) {
      __return_storage_ptr__->m_count = uVar1;
    }
    pOVar2 = __return_storage_ptr__->m_a;
    if (this->m_dP == (double *)0x0) {
      if (this->m_fP != (float *)0x0) {
        uVar1 = this->m_point_stride;
        pfVar4 = this->m_fP + 2;
        do {
          pOVar2->x = pfVar4[-2];
          pOVar2->y = pfVar4[-1];
          pOVar2->z = *pfVar4;
          pOVar2 = pOVar2 + 1;
          pfVar4 = pfVar4 + uVar1;
          uVar5 = (int)new_capacity - 1;
          new_capacity = (ulong)uVar5;
        } while (uVar5 != 0);
      }
    }
    else {
      uVar1 = this->m_point_stride;
      pdVar3 = this->m_dP + 2;
      do {
        pOVar2->x = (float)pdVar3[-2];
        pOVar2->y = (float)pdVar3[-1];
        pOVar2->z = (float)*pdVar3;
        pOVar2 = pOVar2 + 1;
        pdVar3 = pdVar3 + uVar1;
        uVar5 = (int)new_capacity - 1;
        new_capacity = (ulong)uVar5;
      } while (uVar5 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SimpleArray<ON_3fPoint> ON_3dPointListRef::To3fPointArray() const
{
  ON_SimpleArray<ON_3fPoint> a;

  unsigned int i = m_point_count;
  if ( i > 0 )
  {
    a.Reserve(i);
    a.SetCount(i);
    float* dst = (float*)a.Array();
    if ( m_dP )
    {
      const double* src = m_dP;
      while(i--)
      {
        *dst++ = (float)src[0];
        *dst++ = (float)src[1];
        *dst++ = (float)src[2];
        src += m_point_stride;
      }
    }
    else if ( m_fP )
    {
      const float* src = m_fP;
      while(i--)
      {
        *dst++ = src[0];
        *dst++ = src[1];
        *dst++ = src[2];
        src += m_point_stride;
      }
    }
  }

  // Note: 
  //  ON_SimpleArray<ON_3fPoint> has rvalue copy constructor
  //  and operator=, so this return does not create a copy.
  return a;
}